

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

void host_delete(Host *host)

{
  Host *host_00;
  
  if (host != (Host *)0x0) {
    host_00 = host;
    if ((host->init).use_sgb_border != FALSE) {
      host_destroy_texture(host,host->sgb_fb_texture);
    }
    host_destroy_texture(host_00,host->fb_texture);
    SDL_GL_DeleteContext(host->gl_context);
    SDL_DestroyWindow(host->window);
    SDL_Quit();
    joypad_delete(host->joypad_buffer);
    rewind_delete(host->rewind_buffer);
    free((host->audio).buffer);
    free(host);
    return;
  }
  return;
}

Assistant:

void host_delete(Host* host) {
  if (host) {
    if (host->init.use_sgb_border) {
      host_destroy_texture(host, host->sgb_fb_texture);
    }
    host_destroy_texture(host, host->fb_texture);
    SDL_GL_DeleteContext(host->gl_context);
    SDL_DestroyWindow(host->window);
    SDL_Quit();
    joypad_delete(host->joypad_buffer);
    rewind_delete(host->rewind_buffer);
    xfree(host->audio.buffer);
    xfree(host);
  }
}